

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

LogLevel __thiscall cmMakefile::GetCurrentLogLevel(cmMakefile *this)

{
  cmake *pcVar1;
  LogLevel LVar2;
  string *psVar3;
  char *extraout_RDX;
  LogLevel LVar4;
  string_view levelStr;
  allocator<char> local_41;
  string local_40;
  
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  LVar4 = pcVar1->MessageLogLevel;
  if (LVar4 != LOG_UNDEFINED) {
    if (pcVar1->LogLevelWasSetViaCLI == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_MESSAGE_LOG_LEVEL",&local_41);
      psVar3 = GetSafeDefinition(this,&local_40);
      levelStr._M_str = extraout_RDX;
      levelStr._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
      LVar2 = cmake::StringToLogLevel((cmake *)psVar3->_M_string_length,levelStr);
      std::__cxx11::string::~string((string *)&local_40);
      if (LVar2 != LOG_UNDEFINED) {
        LVar4 = LVar2;
      }
    }
    return LVar4;
  }
  __assert_fail("\"Expected a valid log level here\" && logLevelCliOrDefault != Message::LogLevel::LOG_UNDEFINED"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0x9e,"Message::LogLevel cmMakefile::GetCurrentLogLevel() const");
}

Assistant:

cmake* cmMakefile::GetCMakeInstance() const
{
  return this->GlobalGenerator->GetCMakeInstance();
}